

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::CryptoTest::
TestVector<CHMAC_SHA512,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CHMAC_SHA512 *h,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long uVar3;
  size_type sVar4;
  void *in_RSI;
  long in_FS_OFFSET;
  size_t len;
  size_t pos;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  CHMAC_SHA512 hasher;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff828;
  undefined7 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff837;
  undefined7 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff83f;
  size_type in_stack_fffffffffffff840;
  undefined7 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84f;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffff850;
  undefined7 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff85f;
  lazy_ostream *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  ulong local_6e8;
  int local_6e0;
  lazy_ostream local_690 [2];
  assertion_result local_670 [2];
  const_string local_638 [2];
  lazy_ostream local_618 [2];
  assertion_result local_5f8 [2];
  const_string local_5c0 [2];
  lazy_ostream local_5a0 [2];
  assertion_result local_580 [2];
  const_string local_548 [2];
  lazy_ostream local_528 [2];
  assertion_result local_508 [3];
  undefined1 local_4b8 [400];
  undefined1 local_328 [400];
  undefined1 local_198 [400];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               (unsigned_long)in_stack_fffffffffffff828);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               (const_string *)in_stack_fffffffffffff860,
               CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
               (const_string *)in_stack_fffffffffffff850);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (bool)in_stack_fffffffffffff837);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               (unsigned_long)in_stack_fffffffffffff828);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               (basic_cstring<const_char> *)in_stack_fffffffffffff828);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               (unsigned_long)in_stack_fffffffffffff828);
    in_stack_fffffffffffff828 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_508,local_528,local_548,0x25,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff828);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff828);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),in_stack_fffffffffffff840
            );
  memcpy(local_198,in_RSI,400);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828);
  CHMAC_SHA512::Write((CHMAC_SHA512 *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                      (uchar *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                      (size_t)in_stack_fffffffffffff828);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828);
  CHMAC_SHA512::Finalize
            ((CHMAC_SHA512 *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
             (uchar *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               (unsigned_long)in_stack_fffffffffffff828);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               (const_string *)in_stack_fffffffffffff860,
               CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
               (const_string *)in_stack_fffffffffffff850);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff850);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (bool)in_stack_fffffffffffff837);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               (unsigned_long)in_stack_fffffffffffff828);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               (basic_cstring<const_char> *)in_stack_fffffffffffff828);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               (unsigned_long)in_stack_fffffffffffff828);
    in_stack_fffffffffffff828 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_580,local_5a0,local_5c0,0x2a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff828);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff828);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_6e0 = 0; local_6e0 < 0x20; local_6e0 = local_6e0 + 1) {
    memcpy(local_328,in_RSI,400);
    local_6e8 = 0;
    while (sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffff828), local_6e8 < sVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828)
      ;
      uVar3 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                        (in_stack_fffffffffffff850,
                         CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828)
      ;
      CHMAC_SHA512::Write((CHMAC_SHA512 *)
                          CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                          (uchar *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                          (size_t)in_stack_fffffffffffff828);
      local_6e8 = uVar3 + local_6e8;
      if (local_6e8 != 0) {
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff828);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff828);
        if ((sVar4 < local_6e8 + sVar2 * 2) &&
           (sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffff828), local_6e8 < sVar2)) {
          memcpy(local_4b8,local_328,400);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff828);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff828);
          CHMAC_SHA512::Write((CHMAC_SHA512 *)
                              CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                              (uchar *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830)
                              ,(size_t)in_stack_fffffffffffff828);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff828);
          CHMAC_SHA512::Finalize
                    ((CHMAC_SHA512 *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                     (uchar *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                       (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                       (unsigned_long)in_stack_fffffffffffff828);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff828);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                       (const_string *)in_stack_fffffffffffff860,
                       CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                       (const_string *)in_stack_fffffffffffff850);
            in_stack_fffffffffffff86f =
                 std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffff850);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                       (bool)in_stack_fffffffffffff837);
            in_stack_fffffffffffff860 = boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                       (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                       (unsigned_long)in_stack_fffffffffffff828);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff828);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                       (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                       (unsigned_long)in_stack_fffffffffffff828);
            in_stack_fffffffffffff828 =
                 (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_5f8,local_618,local_638,0x37,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl(in_stack_fffffffffffff828);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff828);
            in_stack_fffffffffffff85f = boost::test_tools::tt_detail::dummy_cond();
          } while ((bool)in_stack_fffffffffffff85f);
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff828);
    CHMAC_SHA512::Finalize
              ((CHMAC_SHA512 *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
               (uchar *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
    do {
      in_stack_fffffffffffff850 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                 (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                 (unsigned_long)in_stack_fffffffffffff828);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff828);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (const_string *)in_stack_fffffffffffff860,
                 CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                 (const_string *)in_stack_fffffffffffff850);
      in_stack_fffffffffffff84f =
           std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff850);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                 (bool)in_stack_fffffffffffff837);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                 (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                 (unsigned_long)in_stack_fffffffffffff828);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff828);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                 (pointer)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                 (unsigned_long)in_stack_fffffffffffff828);
      in_stack_fffffffffffff828 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_670,local_690,(const_string *)&stack0xfffffffffffff950,0x3b,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff828);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff828);
      in_stack_fffffffffffff83f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff83f);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}